

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool op_smlad(DisasContext_conflict1 *s,arg_rrrr *a,_Bool m_swap,_Bool sub)

{
  ulong uVar1;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 a_00;
  TCGv_i32 pTVar2;
  uintptr_t o;
  
  uVar1 = s->features;
  if ((uVar1 & 8) != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    a_00 = load_reg(s,a->rn);
    pTVar2 = load_reg(s,a->rm);
    if (m_swap) {
      gen_swap_half(tcg_ctx,pTVar2);
    }
    gen_smul_dual(tcg_ctx,a_00,pTVar2);
    if (sub) {
      tcg_gen_sub_i32(tcg_ctx,a_00,a_00,pTVar2);
    }
    else {
      gen_helper_add_setq(tcg_ctx,a_00,tcg_ctx->cpu_env,a_00,pTVar2);
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    if (a->ra != 0xf) {
      pTVar2 = load_reg(s,a->ra);
      gen_helper_add_setq(tcg_ctx,a_00,tcg_ctx->cpu_env,a_00,pTVar2);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    }
    store_reg(s,a->rd,a_00);
  }
  return SUB41(((uint)uVar1 & 8) >> 3,0);
}

Assistant:

static bool op_smlad(DisasContext *s, arg_rrrr *a, bool m_swap, bool sub)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2;

    if (!ENABLE_ARCH_6) {
        return false;
    }

    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    if (m_swap) {
        gen_swap_half(tcg_ctx, t2);
    }
    gen_smul_dual(tcg_ctx, t1, t2);

    if (sub) {
        /* This subtraction cannot overflow. */
        tcg_gen_sub_i32(tcg_ctx, t1, t1, t2);
    } else {
        /*
         * This addition cannot overflow 32 bits; however it may
         * overflow considered as a signed operation, in which case
         * we must set the Q flag.
         */
        gen_helper_add_setq(tcg_ctx, t1, tcg_ctx->cpu_env, t1, t2);
    }
    tcg_temp_free_i32(tcg_ctx, t2);

    if (a->ra != 15) {
        t2 = load_reg(s, a->ra);
        gen_helper_add_setq(tcg_ctx, t1, tcg_ctx->cpu_env, t1, t2);
        tcg_temp_free_i32(tcg_ctx, t2);
    }
    store_reg(s, a->rd, t1);
    return true;
}